

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_ReadBIOEmpty_Test::~X509Test_ReadBIOEmpty_Test
          (X509Test_ReadBIOEmpty_Test *this)

{
  X509Test_ReadBIOEmpty_Test *this_local;
  
  ~X509Test_ReadBIOEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(X509Test, ReadBIOEmpty) {
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(nullptr, 0));
  ASSERT_TRUE(bio);

  // CPython expects |ASN1_R_HEADER_TOO_LONG| on EOF, to terminate a series of
  // certificates.
  bssl::UniquePtr<X509> x509(d2i_X509_bio(bio.get(), nullptr));
  EXPECT_FALSE(x509);
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_ASN1, ASN1_R_HEADER_TOO_LONG));
}